

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O3

bool __thiscall QProgressBarPrivate::repaintRequired(QProgressBarPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  ulong uVar4;
  QStyle *pQVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  QLatin1String QVar12;
  QLatin1String QVar13;
  QStyleOptionProgressBar opt;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QPalettePrivate *pQStack_80;
  undefined1 *local_78;
  QObject *pQStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  QArrayData *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->value;
  iVar2 = this->lastPaintedValue;
  if (iVar1 == iVar2) {
    bVar10 = false;
  }
  else {
    lVar6 = (long)iVar1 - (long)iVar2;
    lVar8 = -lVar6;
    if (0 < lVar6) {
      lVar8 = lVar6;
    }
    iVar3 = *(int *)&(this->super_QWidgetPrivate).field_0x254;
    bVar10 = true;
    if ((iVar1 != iVar3) && (iVar1 != this->maximum)) {
      this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      bVar9 = true;
      iVar7 = this->maximum - iVar3;
      if (iVar7 != 0) {
        bVar9 = ((iVar1 - iVar3) * 100) / iVar7 == ((iVar2 - iVar3) * 100) / iVar7;
      }
      if ((this->field_0x264 & 1) != 0) {
        QVar12.m_data = (char *)0x2;
        QVar12.m_size = (qsizetype)&this->format;
        lVar6 = QString::indexOf(QVar12,0x6dc08b,CaseInsensitive);
        bVar10 = true;
        if (lVar6 != -1) goto LAB_00468fe8;
        QVar13.m_data = (char *)0x2;
        QVar13.m_size = (qsizetype)&this->format;
        lVar6 = QString::indexOf(QVar13,0x6f3e96,CaseInsensitive);
        if ((bool)(~bVar9 & lVar6 != -1)) goto LAB_00468fe8;
      }
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_70 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_80 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)local_a8);
      (**(code **)(*(long *)this_00 + 0x1a8))(this_00,local_a8);
      pQVar5 = QWidget::style(this_00);
      auVar11 = (**(code **)(*(long *)pQVar5 + 0xc0))(pQVar5,0xc,local_a8,this_00);
      bVar10 = *(int *)(*(long *)&this_00->field_0x8 + 0x26c) == 1;
      uVar4 = auVar11._8_8_ >> 0x20;
      if (bVar10) {
        uVar4 = auVar11._8_8_;
      }
      iVar1 = auVar11._4_4_;
      if (bVar10) {
        iVar1 = auVar11._0_4_;
      }
      bVar10 = (double)iVar7 / (double)(((int)uVar4 - iVar1) + 1) < (double)lVar8;
      if (local_58 != (QArrayData *)0x0) {
        LOCK();
        (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_58,2,0x10);
        }
      }
      QStyleOption::~QStyleOption((QStyleOption *)local_a8);
    }
  }
LAB_00468fe8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar10;
  }
  __stack_chk_fail();
}

Assistant:

bool QProgressBarPrivate::repaintRequired() const
{
    Q_Q(const QProgressBar);
    if (value == lastPaintedValue)
        return false;

    const qint64 valueDifference = qAbs(qint64(value) - qint64(lastPaintedValue));

    if (value == minimum || value == maximum)
        return true;

    const int totalSteps = maximum - minimum;

    const int currentPercentage = totalSteps ? (value - minimum) * 100 / totalSteps : 0;
    const int lastPaintedPercentage = totalSteps ? (lastPaintedValue - minimum) * 100 / totalSteps
                                                 : 0;

    const int percentageChangeConstant = 1;
    const bool percentageChanged = (qAbs(currentPercentage - lastPaintedPercentage) >= percentageChangeConstant);

    if (textVisible) {
        if (format.contains("%v"_L1))
            return true;
        if (format.contains("%p"_L1) && percentageChanged)
            return true;
    }

    // Check if the bar needs to be repainted based on pixel-level differences
    QStyleOptionProgressBar opt;
    q->initStyleOption(&opt);
    QRect groove = q->style()->subElementRect(QStyle::SE_ProgressBarGroove, &opt, q);
    int grooveBlock = (q->orientation() == Qt::Horizontal) ? groove.width() : groove.height();
    const double pixelSize = static_cast<double>(totalSteps) / grooveBlock;
    return valueDifference > pixelSize;
}